

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  long lVar2;
  Net *pNVar3;
  undefined4 y_00;
  uint uVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Net *this;
  Game *pGVar9;
  Game *pGVar10;
  ostream *poVar11;
  Game *pGVar12;
  long lVar13;
  invalid_argument *piVar14;
  string *psVar15;
  string *__val;
  string *unaff_R12;
  uint __len;
  bool bVar16;
  bool bVar17;
  Graphic graphic;
  dialogbox dialog;
  unique_ptr<Game,_std::default_delete<Game>_> game;
  unique_ptr<Net,_std::default_delete<Net>_> net;
  int y;
  int x;
  string input;
  string arg;
  string pass;
  string ip;
  string sx;
  Graphic local_2e2;
  dialogbox local_2e1;
  Game *local_2e0;
  Net *local_2d8;
  uint local_2cc;
  int local_2c8;
  int local_2c4;
  string *local_2c0;
  undefined8 local_2b8;
  undefined1 local_2b0 [32];
  undefined8 local_290;
  undefined1 local_288 [16];
  undefined1 *local_278;
  long local_270;
  undefined1 local_268 [16];
  undefined1 *local_258;
  long local_250;
  undefined1 local_248 [16];
  string local_238;
  undefined1 *local_218 [2];
  undefined1 local_208 [16];
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [24];
  undefined1 local_1a0 [104];
  ios_base local_138 [264];
  
  local_258 = local_248;
  local_250 = 0;
  local_248[0] = 0;
  local_278 = local_268;
  local_270 = 0;
  local_268[0] = 0;
  local_2b0._24_8_ = local_288;
  local_290 = 0;
  local_288[0] = 0;
  local_2e0 = (Game *)0x0;
  local_2d8 = (Net *)0x0;
  iVar6 = intGetOption(anon_var_dwarf_11543);
  if (iVar6 == 0) {
    iVar7 = intGetOption(anon_var_dwarf_11566);
    if (iVar7 == 0) {
      pGVar10 = (Game *)operator_new(0x20);
      Game::Game(pGVar10);
      pGVar12 = local_2e0;
      iVar7 = -1;
      bVar16 = true;
      bVar17 = local_2e0 != (Game *)0x0;
      local_2e0 = pGVar10;
      if (bVar17) {
        Game::~Game(pGVar12);
        operator_delete(pGVar12);
      }
    }
    else {
      local_1b8._8_8_ = (undefined1 *)0x0;
      local_1b8[0x10] = '\0';
      unaff_R12 = (string *)local_2b0;
      local_2b8 = 0;
      local_2b0[0] = 0;
      local_2c0 = unaff_R12;
      local_1b8._0_8_ = (Game *)(local_1b8 + 0x10);
      iVar7 = intGetOption(anon_var_dwarf_1157c);
      iVar8 = intGetOption(anon_var_dwarf_11592);
      if ((8 < iVar7) || (8 < iVar8)) {
        piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar14,"");
        __cxa_throw(piVar14,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      pGVar10 = (Game *)operator_new(0x20);
      Game::Game(pGVar10,iVar7,iVar8);
      pGVar12 = local_2e0;
      bVar16 = local_2e0 != (Game *)0x0;
      local_2e0 = pGVar10;
      if (bVar16) {
        Game::~Game(pGVar12);
        operator_delete(pGVar12);
      }
      if (local_2c0 != unaff_R12) {
        operator_delete(local_2c0);
      }
      if ((Game *)local_1b8._0_8_ != (Game *)(local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_);
      }
      iVar7 = -1;
      bVar16 = true;
    }
    goto LAB_00106332;
  }
  if (iVar6 != 1) {
    piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar14,"");
LAB_00106fcb:
    __cxa_throw(piVar14,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  this = (Net *)operator_new(0x18);
  Net::Net(this);
  pNVar3 = local_2d8;
  bVar16 = local_2d8 != (Net *)0x0;
  local_2d8 = this;
  if (bVar16) {
    Net::~Net(pNVar3);
    operator_delete(pNVar3);
  }
  strGetOption_abi_cxx11_((string *)local_1b8,anon_var_dwarf_115b2);
  std::__cxx11::string::operator=((string *)&local_258,(string *)local_1b8);
  pGVar12 = (Game *)(local_1b8 + 0x10);
  if ((Game *)local_1b8._0_8_ != pGVar12) {
    operator_delete((void *)local_1b8._0_8_);
  }
  pNVar3 = local_2d8;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,local_258,local_258 + local_250);
  iVar7 = Net::makeconnect(pNVar3,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_115c8,0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    iVar7 = 1;
    std::ostream::flush();
    goto LAB_00106ef4;
  }
  iVar7 = intGetOption(anon_var_dwarf_115de);
  if (iVar7 == 2) {
    unaff_R12 = (string *)Net::automatch(local_2d8);
    if (unaff_R12 != (string *)0xffffffffffffffff) {
      if (unaff_R12 == (string *)0x0) {
        pGVar10 = (Game *)operator_new(0x20);
        Game::Game(pGVar10);
        pGVar12 = local_2e0;
        bVar16 = local_2e0 != (Game *)0x0;
        local_2e0 = pGVar10;
        if (bVar16) {
          Game::~Game(pGVar12);
          operator_delete(pGVar12);
        }
        Net::makeroom(local_2d8,local_2e0->board->boardx / 2,local_2e0->board->boardy / 2);
        iVar7 = -1;
        bVar16 = true;
        unaff_R12 = (string *)0x0;
        goto LAB_00106332;
      }
      Net::login((Net *)local_1b8,(longlong)local_2d8);
      iVar8 = local_1b8._4_4_;
      if (local_1b8._4_4_ != -1) {
        y_00 = local_1b8._0_4_;
        pGVar12 = (Game *)operator_new(0x20);
        Game::Game(pGVar12,iVar8,y_00);
        goto LAB_0010693e;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_115c8,0x1f);
      iVar7 = 1;
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      goto LAB_00106962;
    }
    iVar7 = 2;
  }
  else {
    if (iVar7 != 1) {
      if (iVar7 != 0) {
        piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar14,"");
        goto LAB_00106fcb;
      }
      iVar7 = intGetOption(anon_var_dwarf_11566);
      if (iVar7 == 0) {
        pGVar9 = (Game *)operator_new(0x20);
        Game::Game(pGVar9);
        pGVar10 = local_2e0;
        bVar16 = local_2e0 != (Game *)0x0;
        local_2e0 = pGVar9;
        if (bVar16) {
          Game::~Game(pGVar10);
          goto LAB_001065e9;
        }
      }
      else {
        local_1b8._8_8_ = (undefined1 *)0x0;
        local_1b8[0x10] = '\0';
        local_2b8 = 0;
        local_2b0[0] = 0;
        local_2c0 = (string *)local_2b0;
        local_1b8._0_8_ = pGVar12;
        iVar7 = intGetOption(anon_var_dwarf_1157c);
        iVar8 = intGetOption(anon_var_dwarf_11592);
        if ((8 < iVar7) || (8 < iVar8)) {
          piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar14,"");
          __cxa_throw(piVar14,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        pGVar9 = (Game *)operator_new(0x20);
        Game::Game(pGVar9,iVar7,iVar8);
        pGVar10 = local_2e0;
        bVar16 = local_2e0 != (Game *)0x0;
        local_2e0 = pGVar9;
        if (bVar16) {
          Game::~Game(pGVar10);
          operator_delete(pGVar10);
        }
        if (local_2c0 != (string *)local_2b0) {
          operator_delete(local_2c0);
        }
        pGVar10 = (Game *)local_1b8._0_8_;
        if ((Game *)local_1b8._0_8_ != pGVar12) {
LAB_001065e9:
          operator_delete(pGVar10);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_115f4,0x25);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
      std::ostream::put('`');
      poVar11 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,anon_var_dwarf_1160a,0x22);
      std::operator>>((istream *)&std::cin,(string *)(local_2b0 + 0x18));
      iVar7 = std::__cxx11::string::compare(local_2b0 + 0x18);
      if (iVar7 == 0) {
        strGetOption_abi_cxx11_((string *)local_1b8,anon_var_dwarf_11636);
        std::__cxx11::string::operator=((string *)&local_278,(string *)local_1b8);
        if ((Game *)local_1b8._0_8_ != pGVar12) {
          operator_delete((void *)local_1b8._0_8_);
        }
        pNVar3 = local_2d8;
        iVar7 = local_2e0->board->boardx;
        iVar8 = local_2e0->board->boardy;
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,local_278,local_278 + local_270);
        unaff_R12 = (string *)Net::makeroom(pNVar3,iVar7 / 2,iVar8 / 2,&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p);
        }
      }
      else {
        unaff_R12 = (string *)
                    Net::makeroom(local_2d8,local_2e0->board->boardx / 2,
                                  local_2e0->board->boardy / 2);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_1164c,0xd);
      *(uint *)(std::__throw_out_of_range + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__throw_out_of_range + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      poVar11 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
      lVar13 = *(long *)poVar11;
      lVar2 = *(long *)(lVar13 + -0x18);
      *(uint *)(poVar11 + lVar2 + 0x18) = *(uint *)(poVar11 + lVar2 + 0x18) & 0xffffffb5 | 2;
      std::ios::widen((char)*(undefined8 *)(lVar13 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      iVar7 = -1;
      bVar16 = true;
      goto LAB_00106332;
    }
    *(uint *)(std::invalid_argument::invalid_argument + *(long *)(std::cin + -0x18)) =
         *(uint *)(std::invalid_argument::invalid_argument + *(long *)(std::cin + -0x18)) &
         0xffffffb5 | 8;
    unaff_R12 = (string *)llGetOption(anon_var_dwarf_11662);
    *(uint *)(std::invalid_argument::invalid_argument + *(long *)(std::cin + -0x18)) =
         *(uint *)(std::invalid_argument::invalid_argument + *(long *)(std::cin + -0x18)) &
         0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_11678,0x2e);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    poVar11 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,anon_var_dwarf_1168e,0x34);
    std::operator>>((istream *)&std::cin,(string *)(local_2b0 + 0x18));
    iVar7 = std::__cxx11::string::compare(local_2b0 + 0x18);
    if ((iVar7 != 0) && (iVar7 = std::__cxx11::string::compare(local_2b0 + 0x18), iVar7 != 0)) {
      piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar14,"");
      __cxa_throw(piVar14,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    iVar7 = std::__cxx11::string::compare(local_2b0 + 0x18);
    if (iVar7 == 0) {
      strGetOption_abi_cxx11_((string *)local_1b8,anon_var_dwarf_11636);
      std::__cxx11::string::operator=((string *)&local_278,(string *)local_1b8);
      if ((Game *)local_1b8._0_8_ != pGVar12) {
        operator_delete((void *)local_1b8._0_8_);
      }
      pNVar3 = local_2d8;
      local_218[0] = local_208;
      std::__cxx11::string::_M_construct<char*>((string *)local_218,local_278,local_278 + local_270)
      ;
      Net::login((Net *)local_1b8,(longlong)pNVar3,unaff_R12);
      iVar7 = local_1b8._0_4_;
      iVar8 = local_1b8._4_4_;
      if (local_218[0] != local_208) {
        operator_delete(local_218[0]);
      }
    }
    else {
      Net::login((Net *)local_1b8,(longlong)local_2d8);
      iVar7 = local_1b8._0_4_;
      iVar8 = local_1b8._4_4_;
    }
    if (iVar8 == -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_115c8,0x1f);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
      std::ostream::put('`');
      iVar7 = 1;
      std::ostream::flush();
    }
    else {
      pGVar12 = (Game *)operator_new(0x20);
      Game::Game(pGVar12,iVar8,iVar7);
LAB_0010693e:
      pGVar10 = local_2e0;
      iVar7 = 0;
      bVar16 = local_2e0 != (Game *)0x0;
      local_2e0 = pGVar12;
      if (bVar16) {
        Game::~Game(pGVar10);
        operator_delete(pGVar10);
      }
    }
LAB_00106962:
    if (iVar8 == -1) goto LAB_00106ef4;
    iVar7 = 1;
  }
  bVar16 = false;
LAB_00106332:
  Graphic::Graphic(&local_2e2);
  dialogbox::dialogbox(&local_2e1);
  Graphic::StartGame(&local_2e2);
  Graphic::Put(&local_2e2,&local_2e0->board->delta);
  if (iVar6 == 1) {
    Graphic::netchangeturn(&local_2e2,local_2e0->turn,iVar7);
    if (bVar16) {
      __val = (string *)-(long)unaff_R12;
      if (0 < (long)unaff_R12) {
        __val = unaff_R12;
      }
      __len = 1;
      if ((string *)0x9 < __val) {
        psVar15 = __val;
        uVar4 = 4;
        do {
          __len = uVar4;
          if (psVar15 < (string *)0x64) {
            __len = __len - 2;
            goto LAB_00106981;
          }
          if (psVar15 < (string *)0x3e8) {
            __len = __len - 1;
            goto LAB_00106981;
          }
          if (psVar15 < (string *)0x2710) goto LAB_00106981;
          bVar16 = (string *)0x1869f < psVar15;
          psVar15 = (string *)((ulong)psVar15 / 10000);
          uVar4 = __len + 4;
        } while (bVar16);
        __len = __len + 1;
      }
LAB_00106981:
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_238,(char)__len - (char)((long)unaff_R12 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long_long>
                (local_238._M_dataplus._M_p + -((long)unaff_R12 >> 0x3f),__len,
                 (unsigned_long_long)__val);
      Graphic::netwait(&local_2e2,&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
    }
  }
  else {
    Graphic::changeturn(&local_2e2,local_2e0->turn);
  }
  local_2c0 = (string *)local_2b0;
  local_2b8 = 0;
  local_2b0[0] = 0;
  pcVar1 = local_1b8 + 8;
  local_2cc = 0;
LAB_00106a13:
  if (iVar6 == 1) {
    do {
      if ((local_2d8->closed != 0) || ((iVar7 == local_2e0->turn && (local_2d8->ready != 0))))
      break;
      Net::get_abi_cxx11_((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                           *)local_1b8,local_2d8);
      lVar13 = std::__cxx11::string::find(pcVar1,0x10b5de,0);
      if ((lVar13 == -1) && (lVar13 = std::__cxx11::string::find(pcVar1,0x10b5e5,0), lVar13 == -1))
      {
        lVar13 = std::__cxx11::string::find(pcVar1,0x10b5eb,0);
        if ((lVar13 == -1) || (iVar7 == local_2e0->turn)) {
          lVar13 = std::__cxx11::string::find(pcVar1,0x10b5ef,0);
          if ((lVar13 == -1) || (iVar7 == local_2e0->turn)) {
            lVar13 = std::__cxx11::string::find(pcVar1,0x10b5f3,0);
            if (lVar13 == -1) goto LAB_00106a8a;
            Graphic::netchangeturn(&local_2e2,local_2e0->turn,iVar7);
            local_2d8->ready = 1;
            local_2d8->started = 1;
            bVar16 = false;
            goto LAB_00106a8c;
          }
          Game::put(local_2e0,local_1b8._4_4_,local_1b8._0_4_);
          Graphic::Put(&local_2e2,&local_2e0->board->delta);
        }
        else {
          Game::put(local_2e0,local_1b8._4_4_,local_1b8._0_4_,local_2cc);
          Graphic::Put(&local_2e2,&local_2e0->board->delta);
        }
        bVar16 = true;
        Graphic::netchangeturn(&local_2e2,local_2e0->turn,iVar7);
      }
      else {
        local_2d8->closed = 1;
LAB_00106a8a:
        bVar16 = true;
      }
LAB_00106a8c:
      if ((undefined1 *)local_1b8._8_8_ != local_1a0) {
        operator_delete((void *)local_1b8._8_8_);
      }
    } while (!bVar16);
  }
  do {
    if ((iVar6 != 0) && (local_2d8->closed != 0)) goto LAB_00106d63;
    cVar5 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '\b');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_2c0,cVar5);
    iVar8 = std::__cxx11::string::compare((char *)&local_2c0);
    if (iVar8 != 0) break;
    bVar16 = local_2cc == 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\x1b[2;42H\x1b[0K",0xb);
    local_2cc = (uint)bVar16;
  } while( true );
  iVar8 = std::__cxx11::string::compare((char *)&local_2c0);
  if (iVar8 == 0) {
    Net::closing(local_2d8);
  }
  else {
    std::__cxx11::stringstream::stringstream
              ((stringstream *)local_1b8,(string *)&local_2c0,_S_out|_S_in);
    iVar8 = __isoc99_sscanf(local_2c0,"%x %x",&local_2c4,&local_2c8);
    if (((iVar8 < 2) || (0xf < local_2c4)) || (0xf < local_2c8)) {
      piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar14,"");
      __cxa_throw(piVar14,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
LAB_00106d63:
  if ((iVar6 == 0) || ((iVar7 == local_2e0->turn && (local_2d8->ready != 0)))) {
    if (local_2cc == 0) {
      bVar16 = Game::put(local_2e0,local_2c4,local_2c8);
      if (bVar16) {
        if (iVar6 == 1) {
          Net::put(local_2d8,local_2c4,local_2c8);
        }
        Graphic::Put(&local_2e2,&local_2e0->board->delta);
        goto LAB_00106e06;
      }
LAB_00106e22:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\x1b[2;42H\x1b[0K",0xb);
    }
    else {
      bVar16 = Game::put(local_2e0,local_2c4,local_2c8,1);
      if (!bVar16) goto LAB_00106e22;
      if (iVar6 == 1) {
        Net::freeput(local_2d8,local_2c4,local_2c8);
      }
      Graphic::Put(&local_2e2,&local_2e0->board->delta);
LAB_00106e06:
      if (iVar6 == 1) {
        Graphic::netchangeturn(&local_2e2,local_2e0->turn,iVar7);
      }
      else {
        Graphic::changeturn(&local_2e2,local_2e0->turn);
      }
    }
    if (local_2e0->full == true) {
      dialogbox::EndGameDialogBox(&local_2e1,local_2e0->b,local_2e0->w,local_2e0->howturn);
      Graphic::end(&local_2e2);
      local_2e0->full = false;
    }
  }
  if (((iVar6 != 1) || (local_2d8->closed != 1)) || (local_2d8->ready != 1)) goto LAB_00106a13;
  dialogbox::ConnectionclosedDialogBox(&local_2e1);
  Graphic::end(&local_2e2);
  local_2d8->ready = 0;
  if (local_2c0 != (string *)local_2b0) {
    operator_delete(local_2c0);
  }
  dialogbox::~dialogbox(&local_2e1);
  Graphic::~Graphic(&local_2e2);
  iVar7 = 0;
LAB_00106ef4:
  pNVar3 = local_2d8;
  if (local_2d8 != (Net *)0x0) {
    Net::~Net(local_2d8);
    operator_delete(pNVar3);
  }
  pGVar12 = local_2e0;
  if (local_2e0 != (Game *)0x0) {
    Game::~Game(local_2e0);
    operator_delete(pGVar12);
  }
  if ((undefined1 *)local_2b0._24_8_ != local_288) {
    operator_delete((void *)local_2b0._24_8_);
  }
  if (local_278 != local_268) {
    operator_delete(local_278);
  }
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  return iVar7;
}

Assistant:

int main(int argc, char *argv[]){
	std::string ip, pass, arg;
	long long room;
	int x, y, mode = -1, netmode = -1, netret, freeput = 0;
	std::unique_ptr<Game> game;
	std::unique_ptr<Net> net;
	try{
		mode=intGetOption("モードを選択してください\n0:オフラインで交互にプレイする 1:オンラインでプレイする場合 :");
		if(mode==0){//offline
			if(intGetOption("盤面サイズを指定しますか?\n0:指定しない 1:指定する :")==0) game.reset(new Game());
			else{
				std::string sx,sy;
				int x,y;
				x=intGetOption("8以下で縦のサイズを入力してください(盤面は入力された数値の倍のサイズになります):");
				y=intGetOption("8以下で横のサイズを入力してください(盤面は入力された数値の倍のサイズになります):");
				if(x>8||y>8)throw std::invalid_argument("");
				game.reset(new Game(x,y));
			}
		} else if(mode==1){//online
			net.reset(new Net());
			ip=strGetOption("サーバーのIPアドレスまたはドメインを入力してください:");
			netret=net->makeconnect(ip);
			if(netret){
				std::cout<<"通信エラー:終了します"<<std::endl;
				return 1;
			}
			netmode=intGetOption("モードを選択してください\n0:ホストとして部屋を立てる 1:ゲストとして部屋に入る 2:オートマッチング :");
			if(netmode==0){//host
				netmode=-1;
				if(netret==-1){
					std::cout<<"通信エラー:終了します"<<std::endl;
					return 1;
				}
				if(intGetOption("盤面サイズを指定しますか?\n0:指定しない 1:指定する :")==0){
					game.reset(new Game());
				} else{
					std::string sx,sy;
					int x,y;
					x=intGetOption("8以下で縦のサイズを入力してください(盤面は入力された数値の倍のサイズになります):");
					y=intGetOption("8以下で横のサイズを入力してください(盤面は入力された数値の倍のサイズになります):");
					if(x>8||y>8)throw std::invalid_argument("");
					game.reset(new Game(x,y));
				}
				std::cout<<"パスワードを設定しますか?"<<std::endl<<"0:設定しない 1:設定する :";
				std::cin>>arg;
				if(!arg.compare("1")){
					pass=strGetOption("パスワードを入力してください:");
					room=net->makeroom(game->board->boardx/2,game->board->boardy/2,pass);
				} else 	room=net->makeroom(game->board->boardx/2,game->board->boardy/2);
				std::cout<<"部屋番号:"<<std::hex<<room<<std::dec<<std::endl;
			} else if(netmode==1){//guest
				netmode=1;
				std::tuple<int,int> size;
				std::cin.setf(std::ios::hex,std::ios::basefield);
				room=llGetOption("部屋番号を入力してください:");
				std::cin.setf(std::ios::dec,std::ios::basefield);
				std::cout<<"パスワードが設定されていますか?"<<std::endl<<"0:設定されていない 1:設定されている :";
				std::cin>>arg;
				if(arg.compare("0")&&arg.compare("1"))throw std::invalid_argument("");
				else if(!arg.compare("1")){
					pass=strGetOption("パスワードを入力してください:");
					size=net->login(room,pass);
				} else{
					size=net->login(room);
				}
				if(std::get<0>(size)==-1){
					std::cout<<"通信エラー:終了します"<<std::endl;
					return 1;
				}
				game.reset(new Game(std::get<0>(size),std::get<1>(size)));
			} else if(netmode==2){//automatch
				room=net->automatch();
				if(room==0){
					netmode=-1;
					game.reset(new Game());
					net->makeroom(game->board->boardx/2,game->board->boardy/2);
				} else if(room!=-1){
					netmode=1;
					std::tuple<int,int> size;
					size=net->login(room);
					if(std::get<0>(size)==-1){
						std::cout<<"通信エラー:終了します"<<std::endl;
						return 1;
					}
					game.reset(new Game(std::get<0>(size),std::get<1>(size)));
				}
			} else throw std::invalid_argument("");
		} else  throw std::invalid_argument("");
	} catch(const std::invalid_argument &e){
		std::cout<<"入力が不正です:終了します";
		return 1;
	}
	Graphic graphic;
	dialogbox dialog;

	graphic.StartGame();
	graphic.Put(game->board->delta);
	if(mode==1){
		graphic.netchangeturn(game->turn,netmode);
		if(netmode==-1)graphic.netwait(std::to_string(room));
	}else graphic.changeturn(game->turn);
	std::string input;
	while(true){
		if(mode==1&&net->closed == 0&&(netmode!=game->turn||!net->ready)){
			std::tuple<std::string, int, int> action = net->get();
			if(std::get<0>(action).find("nodata")!=std::string::npos || std::get<0>(action).find("CLOSE")!=std::string::npos){
				net->closed = 1;
			} else if(std::get<0>(action).find("FREEPUT")!=std::string::npos && netmode != game->turn){
				game->put(std::get<1>(action), std::get<2>(action), freeput);
				graphic.Put(game->board->delta);
				graphic.netchangeturn(game->turn,netmode);
			} else if(std::get<0>(action).find("PUT")!=std::string::npos && netmode != game->turn){
				game->put(std::get<1>(action), std::get<2>(action));
				graphic.Put(game->board->delta);
				graphic.netchangeturn(game->turn,netmode);
			} else if(std::get<0>(action).find("READY")!=std::string::npos){
				graphic.netchangeturn(game->turn,netmode);
				net->started = 1;
				net->ready = 1;
				continue;
			}
		}
		while(mode==0||net->closed==0){
			std::getline(std::cin,input);
			if(!input.compare("free")){
				freeput=!freeput;
				std::cout<<"\e[2;42H\e[0K";
				continue;
			}else if(!input.compare("end")){
				net->closing();
				break;
			}
			try{
				std::stringstream stream(input);
				if(sscanf(input.c_str(),"%x %x",&x,&y)<2||x>15||y>15)throw std::invalid_argument("");
				break;
			}catch(const std::invalid_argument& e){
				std::cout<<"\e[2;42H\e[0K";
			}
		}
		if(mode == 0 || (netmode == game->turn&&net->ready)){
			if(freeput == 0){
				if(game->put(x, y)){
					if(mode == 1)net->put(x, y);
					graphic.Put(game->board->delta);
					if(mode == 1)graphic.netchangeturn(game->turn,netmode);
					else graphic.changeturn(game->turn);
				}else{
					std::cout<<"\e[2;42H\e[0K";
				}
			} else {
				if(game->put(x, y, freeput)){
					if(mode == 1)net->freeput(x, y);
					graphic.Put(game->board->delta);
					if(mode == 1)graphic.netchangeturn(game->turn,netmode);
					else graphic.changeturn(game->turn);
				}else{
					std::cout<<"\e[2;42H\e[0K";
				}
			}
			if(game->full){
				dialog.EndGameDialogBox(game->b, game->w, game->howturn);
				graphic.end();
				game->full = false;
			}
		}
			if(mode == 1 && net->closed == 1 && net->ready == 1){
				dialog.ConnectionclosedDialogBox();
				graphic.end();
				net->ready=0;
				break;
			}
	}
	return 0;
}